

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void run(void)

{
  int head;
  long lVar1;
  long lVar2;
  int path [16];
  int aiStack_68 [16];
  
  if (0 < nodeNum) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      if ((0 < *(int *)((long)outDegrees + lVar2)) && (0 < *(int *)((long)inDegrees + lVar2))) {
        head = (int)lVar1;
        dfs_range1(head,head,1);
        dfs_range2(head,head,1);
        dfs(head,head,1,aiStack_68);
      }
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 4;
    } while (lVar1 < nodeNum);
  }
  return;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}